

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::keyPressEvent(QWidget *this,QKeyEvent *event)

{
  char cVar1;
  int __fd;
  
  if ((char)(this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i == '\t') {
    __fd = 0x46;
    cVar1 = QKeyEvent::matches((StandardKey)event);
    if (cVar1 != '\0') {
      event[0xc] = (QKeyEvent)0x1;
      close(this,__fd);
      return;
    }
  }
  event[0xc] = (QKeyEvent)0x0;
  return;
}

Assistant:

void QWidget::keyPressEvent(QKeyEvent *event)
{
#ifndef QT_NO_SHORTCUT
    if ((windowType() == Qt::Popup) && event->matches(QKeySequence::Cancel)) {
        event->accept();
        close();
    } else
#endif
    {
        event->ignore();
    }
}